

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void http_on_close_client(intptr_t uuid,fio_protocol_s *protocol)

{
  _func_void_intptr_t_fio_protocol_s_ptr *__ptr;
  
  __ptr = protocol[1].on_ready;
  if (*(code **)(__ptr + 0x18) != (code *)0x0) {
    (**(code **)(__ptr + 0x18))(__ptr);
  }
  (**(code **)(__ptr + 0x80))(uuid,protocol);
  free(*(void **)(__ptr + 0x28));
  free(__ptr);
  return;
}

Assistant:

static void http_on_close_client(intptr_t uuid, fio_protocol_s *protocol) {
  http_fio_protocol_s *p = (http_fio_protocol_s *)protocol;
  http_settings_s *set = p->settings;
  void (**original)(intptr_t, fio_protocol_s *) =
      (void (**)(intptr_t, fio_protocol_s *))(set + 1);
  if (set->on_finish)
    set->on_finish(set);

  original[0](uuid, protocol);
  http_settings_free(set);
}